

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
           *this,DenseMapPair<llbuild::core::KeyID,_DBKeyID> *OldBucketsBegin,
          DenseMapPair<llbuild::core::KeyID,_DBKeyID> *OldBucketsEnd)

{
  bool bVar1;
  KeyID *pKVar2;
  KeyID *pKVar3;
  DBKeyID *pDVar4;
  DBKeyID *pDVar5;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDStack_48;
  bool FoundVal;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *DestBucket;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *E;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *B;
  KeyID TombstoneKey;
  KeyID EmptyKey;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *OldBucketsEnd_local;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *OldBucketsBegin_local;
  DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  *this_local;
  
  initEmpty(this);
  TombstoneKey = getEmptyKey();
  B = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)getTombstoneKey();
  DestBucket = OldBucketsEnd;
  E = OldBucketsBegin;
  do {
    if (E == DestBucket) {
      return;
    }
    pKVar2 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(E);
    bVar1 = DenseMapInfo<llbuild::core::KeyID>::isEqual(pKVar2,&TombstoneKey);
    if (!bVar1) {
      pKVar2 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(E);
      bVar1 = DenseMapInfo<llbuild::core::KeyID>::isEqual(pKVar2,(KeyID *)&B);
      if (!bVar1) {
        pKVar2 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(E);
        bVar1 = LookupBucketFor<llbuild::core::KeyID>(this,pKVar2,&stack0xffffffffffffffb8);
        if (bVar1) {
          __assert_fail("!FoundVal && \"Key already in new map?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                        ,0x176,
                        "void llvm::DenseMapBase<llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, llbuild::core::KeyID, DBKeyID, llvm::DenseMapInfo<llbuild::core::KeyID>, llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, BucketT = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>]"
                       );
        }
        pKVar2 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(E);
        pKVar3 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(pDStack_48);
        pKVar3->_value = pKVar2->_value;
        pDVar4 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getSecond(pDStack_48);
        pDVar5 = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getSecond(E);
        pDVar4->value = pDVar5->value;
        incrementNumEntries(this);
        detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getSecond(E);
      }
    }
    detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(E);
    E = E + 1;
  } while( true );
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }